

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprNodeIsConstantOrGroupBy(Walker *pWalker,Expr *pExpr)

{
  SrcList *pSVar1;
  Schema *pB;
  int iVar2;
  CollSeq *p_00;
  CollSeq *pColl;
  Expr *p;
  int i;
  ExprList *pGroupBy;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  pSVar1 = (pWalker->u).pSrcList;
  p._4_4_ = 0;
  do {
    if (pSVar1->nSrc <= p._4_4_) {
      if ((pExpr->flags & 0x1000) == 0) {
        pWalker_local._4_4_ = exprNodeIsConstant(pWalker,pExpr);
      }
      else {
        pWalker->eCode = 0;
        pWalker_local._4_4_ = 2;
      }
      return pWalker_local._4_4_;
    }
    pB = (&pSVar1->a[0].pSchema)[(long)p._4_4_ * 3];
    iVar2 = sqlite3ExprCompare((Parse *)0x0,pExpr,(Expr *)pB,-1);
    if (iVar2 < 2) {
      p_00 = sqlite3ExprNNCollSeq(pWalker->pParse,(Expr *)pB);
      iVar2 = sqlite3IsBinary(p_00);
      if (iVar2 != 0) {
        return 1;
      }
    }
    p._4_4_ = p._4_4_ + 1;
  } while( true );
}

Assistant:

static int exprNodeIsConstantOrGroupBy(Walker *pWalker, Expr *pExpr){
  ExprList *pGroupBy = pWalker->u.pGroupBy;
  int i;

  /* Check if pExpr is identical to any GROUP BY term. If so, consider
  ** it constant.  */
  for(i=0; i<pGroupBy->nExpr; i++){
    Expr *p = pGroupBy->a[i].pExpr;
    if( sqlite3ExprCompare(0, pExpr, p, -1)<2 ){
      CollSeq *pColl = sqlite3ExprNNCollSeq(pWalker->pParse, p);
      if( sqlite3IsBinary(pColl) ){
        return WRC_Prune;
      }
    }
  }

  /* Check if pExpr is a sub-select. If so, consider it variable. */
  if( ExprUseXSelect(pExpr) ){
    pWalker->eCode = 0;
    return WRC_Abort;
  }

  return exprNodeIsConstant(pWalker, pExpr);
}